

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

bool __thiscall
SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>::Prepend
          (SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount> *this,
          JitArenaAllocator *allocator,HashBucket<Sym_*,_Value_*> **data)

{
  Type_conflict pSVar1;
  SListNode<HashBucket<Sym*,Value*>*,Memory::JitArenaAllocator> *pSVar2;
  JitArenaAllocator *alloc;
  SListNode<HashBucket<Sym*,Value*>*,Memory::JitArenaAllocator> *this_00;
  Type_conflict *ppSVar3;
  TrackAllocData local_58;
  SListNode<HashBucket<Sym*,Value*>*,Memory::JitArenaAllocator> *local_30;
  Node *newNode;
  HashBucket<Sym_*,_Value_*> **data_local;
  JitArenaAllocator *allocator_local;
  SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount> *this_local;
  
  newNode = (Node *)data;
  data_local = (HashBucket<Sym_*,_Value_*> **)allocator;
  allocator_local = (JitArenaAllocator *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,
             (type_info *)&SListNode<HashBucket<Sym*,Value*>*,Memory::JitArenaAllocator>::typeinfo,0
             ,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
             ,0x13b);
  alloc = (JitArenaAllocator *)
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)allocator
                     ,&local_58);
  this_00 = (SListNode<HashBucket<Sym*,Value*>*,Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x10,alloc,0x4e98c0);
  SListNode<HashBucket<Sym*,Value*>*,Memory::JitArenaAllocator>::SListNode<HashBucket<Sym*,Value*>*>
            (this_00,(HashBucket<Sym_*,_Value_*> **)newNode);
  if (this_00 != (SListNode<HashBucket<Sym*,Value*>*,Memory::JitArenaAllocator> *)0x0) {
    local_30 = this_00;
    ppSVar3 = SListNodeBase<Memory::JitArenaAllocator>::Next
                        (&this->super_SListNodeBase<Memory::JitArenaAllocator>);
    pSVar1 = *ppSVar3;
    ppSVar3 = SListNodeBase<Memory::JitArenaAllocator>::Next
                        ((SListNodeBase<Memory::JitArenaAllocator> *)local_30);
    pSVar2 = local_30;
    *ppSVar3 = pSVar1;
    ppSVar3 = SListNodeBase<Memory::JitArenaAllocator>::Next
                        (&this->super_SListNodeBase<Memory::JitArenaAllocator>);
    *ppSVar3 = (Type_conflict)pSVar2;
    RealCount::IncrementCount(&this->super_RealCount);
  }
  return this_00 != (SListNode<HashBucket<Sym*,Value*>*,Memory::JitArenaAllocator> *)0x0;
}

Assistant:

bool Prepend(TAllocator * allocator, TData const& data)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, data);
        if (newNode)
        {
            newNode->Next() = this->Next();
            this->Next() = newNode;
            this->IncrementCount();
            return true;
        }
        return false;
    }